

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

json __thiscall
server_task_result_cmpl_final::to_json_abi_cxx11_(server_task_result_cmpl_final *this)

{
  int iVar1;
  long in_RSI;
  json jVar3;
  json_value jVar2;
  
  iVar1 = *(int *)(in_RSI + 0x7f4);
  if (iVar1 == 2) {
    jVar3 = to_json_oaicompat_abi_cxx11_(this);
    jVar2 = jVar3.m_data.m_value;
  }
  else if (iVar1 == 1) {
    if (*(char *)(in_RSI + 0x50) == '\x01') {
      jVar3 = to_json_oaicompat_chat_stream_abi_cxx11_(this);
      jVar2 = jVar3.m_data.m_value;
    }
    else {
      jVar3 = to_json_oaicompat_chat_abi_cxx11_(this);
      jVar2 = jVar3.m_data.m_value;
    }
  }
  else {
    if (iVar1 != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/server/server.cpp"
                 ,0x296,"GGML_ASSERT(%s) failed","false && \"Invalid oaicompat_type\"");
    }
    jVar3 = to_json_non_oaicompat_abi_cxx11_(this);
    jVar2 = jVar3.m_data.m_value;
  }
  jVar3.m_data.m_value.object = jVar2.object;
  jVar3.m_data._0_8_ = this;
  return (json)jVar3.m_data;
}

Assistant:

virtual json to_json() override {
        switch (oaicompat) {
            case OAICOMPAT_TYPE_NONE:
                return to_json_non_oaicompat();
            case OAICOMPAT_TYPE_COMPLETION:
                return to_json_oaicompat();
            case OAICOMPAT_TYPE_CHAT:
                return stream ? to_json_oaicompat_chat_stream() : to_json_oaicompat_chat();
            default:
                GGML_ASSERT(false && "Invalid oaicompat_type");
        }
    }